

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Gia_Man_t * Gia_ManFaultUnfold(Gia_Man_t *p,int fUseMuxes,int fFfOnly)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  
  p_00 = Gia_ManStart((fUseMuxes * 3 + 2) * p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar1;
  }
  for (iVar9 = 0; iVar9 < p->vCis->nSize - p->nRegs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCi(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar1;
  }
  for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManObj(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar2 = Gia_ObjFanin0Copy(pGVar6);
      iVar3 = Gia_ObjFanin1Copy(pGVar6);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGVar6->Value = uVar1;
    }
  }
  for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCo(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjFanin0Copy(pGVar6);
    pGVar6->Value = uVar1;
  }
  for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x9fffffff) != 0) {
LAB_0046582e:
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar3 = Gia_ObjCioId(pGVar6);
    iVar2 = p->vCis->nSize;
    if (iVar3 < iVar2 - p->nRegs) goto LAB_0046582e;
    iVar3 = p->vCos->nSize;
    iVar4 = Gia_ObjCioId(pGVar6);
    pGVar7 = Gia_ManCo(p,(iVar3 - iVar2) + iVar4);
    pGVar6->Value = pGVar7->Value;
  }
  for (iVar9 = 0; iVar9 < p->vCis->nSize - p->nRegs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCi(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar1;
  }
  if (fFfOnly == 0) {
    for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
      pGVar6 = Gia_ManObj(p,iVar9);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        iVar2 = Gia_ManAppendCi(p_00);
        iVar3 = Gia_ObjFanin0Copy(pGVar6);
        iVar4 = Gia_ObjFanin1Copy(pGVar6);
        uVar1 = Gia_ManHashAnd(p_00,iVar3,iVar4);
        if (fUseMuxes != 0) {
          uVar1 = Gia_ManHashMux(p_00,iVar2,pGVar6->Value,uVar1);
        }
        pGVar6->Value = uVar1;
      }
    }
    for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
      pGVar6 = Gia_ManCo(p,iVar9);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFanin0Copy(pGVar6);
      uVar1 = Gia_ManAppendCo(p_00,iVar2);
      pGVar6->Value = uVar1;
    }
  }
  else {
    for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
      pGVar6 = Gia_ManObj(p,iVar9);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        iVar2 = Gia_ObjFanin0Copy(pGVar6);
        iVar3 = Gia_ObjFanin1Copy(pGVar6);
        uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
        pGVar6->Value = uVar1;
      }
    }
    for (iVar9 = 0; iVar9 < p->vCos->nSize - p->nRegs; iVar9 = iVar9 + 1) {
      pGVar6 = Gia_ManCo(p,iVar9);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFanin0Copy(pGVar6);
      uVar1 = Gia_ManAppendCo(p_00,iVar2);
      pGVar6->Value = uVar1;
    }
    for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
      pGVar6 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar9);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ManAppendCi(p_00);
      uVar1 = Gia_ObjFanin0Copy(pGVar6);
      if (fUseMuxes != 0) {
        uVar1 = Gia_ManHashMux(p_00,iVar2,pGVar6->Value,uVar1);
      }
      pGVar6->Value = uVar1;
      uVar1 = Gia_ManAppendCo(p_00,uVar1);
      pGVar6->Value = uVar1;
    }
  }
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar2 = pGVar8->vCis->nSize;
  iVar3 = pGVar8->nRegs;
  iVar4 = p->nRegs;
  iVar9 = iVar4 + (p->vCis->nSize - iVar4) * 2;
  if (fFfOnly == 0) {
    iVar4 = Gia_ManAndNum(p);
  }
  if (iVar2 - iVar3 == iVar9 + iVar4) {
    return pGVar8;
  }
  __assert_fail("Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x177,"Gia_Man_t *Gia_ManFaultUnfold(Gia_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManFaultUnfold( Gia_Man_t * p, int fUseMuxes, int fFfOnly )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl, iThis;
    pNew = Gia_ManStart( (2 + 3 * fUseMuxes) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // add first timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // add second timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ObjFanin0Copy(pObj);
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
        }
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p)) );
    return pNew;
}